

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

iteration_time __thiscall
helics::Federate::requestTimeIterative
          (Federate *this,Time nextInternalTimeStep,IterationRequest iterate)

{
  string_view message;
  Modes MVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  char in_DL;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong uVar4;
  ulong extraout_RDX_04;
  undefined8 in_RSI;
  char *in_RDI;
  iteration_time iVar5;
  iteration_time iterativeTime;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  Time in_stack_ffffffffffffff90;
  Time in_stack_ffffffffffffffa0;
  Time local_10;
  undefined1 local_8;
  
  MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x34372d);
  if (MVar1 == EXECUTING) {
    preTimeRequestOperations
              ((Federate *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff87);
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x34376b);
    local_10.internalTimeCode._0_4_ =
         (*peVar2->_vptr_Core[0x1b])
                   (peVar2,(ulong)*(uint *)(in_RDI + 0x10),in_RSI,(ulong)(uint)(int)in_DL);
    local_10.internalTimeCode._4_4_ = extraout_var;
    local_8 = (undefined1)extraout_RDX;
    MVar1 = (Modes)((ulong)in_RDI >> 0x38);
    uVar4 = extraout_RDX;
    switch(extraout_RDX & 0xff) {
    case 0:
      postTimeRequestOperations
                ((Federate *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff87);
      uVar4 = extraout_RDX_00;
      break;
    case 2:
      postTimeRequestOperations
                ((Federate *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff87);
      uVar4 = extraout_RDX_01;
      break;
    case 3:
      updateFederateMode((Federate *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                         MVar1);
      updateSimulationTime
                (*(Federate **)(in_RDI + 0x28),in_stack_ffffffffffffffa0,local_10,
                 (bool)in_stack_ffffffffffffff8f);
      uVar4 = extraout_RDX_02;
      break;
    case 7:
      updateFederateMode((Federate *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                         MVar1);
      uVar4 = extraout_RDX_03;
    }
  }
  else {
    MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x343890);
    if ((MVar1 != FINALIZE) &&
       (MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x3438a2),
       MVar1 != FINISHED)) {
      uVar3 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),in_RDI);
      message._M_len._7_1_ = in_stack_ffffffffffffff8f;
      message._M_len._0_7_ = in_stack_ffffffffffffff88;
      message._M_str = (char *)in_stack_ffffffffffffff90.internalTimeCode;
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),message);
      __cxa_throw(uVar3,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    local_10.internalTimeCode = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
    local_8 = 3;
    uVar4 = extraout_RDX_04;
  }
  iVar5._9_7_ = (undefined7)(uVar4 >> 8);
  iVar5.state = local_8;
  iVar5.grantedTime.internalTimeCode = local_10.internalTimeCode;
  return iVar5;
}

Assistant:

iteration_time Federate::requestTimeIterative(Time nextInternalTimeStep, IterationRequest iterate)
{
    if (currentMode == Modes::EXECUTING) {
        preTimeRequestOperations(nextInternalTimeStep, iterate != IterationRequest::NO_ITERATIONS);
        auto iterativeTime = coreObject->requestTimeIterative(fedID, nextInternalTimeStep, iterate);
        switch (iterativeTime.state) {
            case IterationResult::NEXT_STEP:
                postTimeRequestOperations(iterativeTime.grantedTime, false);
                break;
            case IterationResult::ITERATING:
                postTimeRequestOperations(iterativeTime.grantedTime, true);
                break;
            case IterationResult::HALTED:
                updateFederateMode(Modes::FINISHED);
                updateSimulationTime(iterativeTime.grantedTime, mCurrentTime, false);
                break;
            case IterationResult::ERROR_RESULT:
                // LCOV_EXCL_START
                updateFederateMode(Modes::ERROR_STATE);
                break;
                // LCOV_EXCL_STOP
        }
        return iterativeTime;
    }
    if (currentMode == Modes::FINALIZE || currentMode == Modes::FINISHED) {
        return {Time::maxVal(), IterationResult::HALTED};
    }
    throw(InvalidFunctionCall("cannot call request time in present state"));
}